

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O2

bool libtorrent::anon_unknown_6::send_peer(peer_connection *p)

{
  int iVar1;
  
  if (((p->field_0x885 & 0x18) != 0) &&
     (((p->super_peer_connection_hot_members).field_0x28 & 2) == 0)) {
    iVar1 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])();
    return (bool)((byte)iVar1 ^ 1);
  }
  return false;
}

Assistant:

bool send_peer(aux::peer_connection const& p)
	{
		// don't send out those peers that we haven't connected to
		// (that have connected to us) and that aren't sharing their
		// listening port
		if (!p.is_outgoing() && !p.received_listen_port()) return false;
		// don't send out peers that we haven't successfully connected to
		if (p.is_connecting()) return false;
		if (p.in_handshake()) return false;
		return true;
	}